

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chardev.c
# Opt level: O2

LispPTR CHAR_bin(int fd,LispPTR errn)

{
  int iVar1;
  LispPTR LVar2;
  undefined8 in_RAX;
  LispPTR *pLVar3;
  int *piVar4;
  ssize_t sVar5;
  undefined8 uStack_38;
  uchar ch [4];
  
  uStack_38 = in_RAX;
  Lisp_errno = (int *)NativeAligned4FromLAddr(errn);
  iVar1 = _setjmp((__jmp_buf_tag *)jmpbuf);
  if (iVar1 == 0) {
    if ((fd & 0xfff0000U) == 0xf0000) {
      LVar2 = fd | 0xffff0000;
    }
    else if ((fd & 0xfff0000U) == 0xe0000) {
      LVar2 = fd & 0xffff;
    }
    else {
      pLVar3 = NativeAligned4FromLAddr(fd);
      LVar2 = *pLVar3;
    }
    alarm(TIMEOUT_TIME);
    piVar4 = __errno_location();
    do {
      *piVar4 = 0;
      sVar5 = read(LVar2,ch,1);
      if (sVar5 != -1) break;
    } while (*piVar4 == 4);
    alarm(0);
    if (sVar5 == 0) {
      *Lisp_errno = 0xb;
      return 0;
    }
    if (sVar5 != -1) {
      LVar2 = GetPosSmallp((ulong)ch[0]);
      return LVar2;
    }
    *Lisp_errno = *piVar4;
  }
  else {
    *Lisp_errno = 100;
  }
  return 0;
}

Assistant:

LispPTR CHAR_bin(int fd, LispPTR errn)
{
#ifndef DOS
  ssize_t rval;
  unsigned char ch[4];
  Lisp_errno = (int *)NativeAligned4FromLAddr(errn);
  ERRSETJMP(NIL);
  fd = LispNumToCInt(fd);

  TIMEOUT(rval = read(fd, ch, 1));
  if (rval == 0) {
    *Lisp_errno = EWOULDBLOCK;
    return (NIL);
  }
  if (rval == -1) {
    *Lisp_errno = errno;
    return (NIL);
  }
  return (GetPosSmallp(ch[0]));
#endif /* DOS */
}